

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.hpp
# Opt level: O2

TestInstance * __thiscall
vkt::texture::util::
TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeBaseLevelTestInstance>::
createInstance(TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeBaseLevelTestInstance>
               *this,Context *context)

{
  TextureCubeLodControlTestInstance *this_00;
  
  this_00 = (TextureCubeLodControlTestInstance *)operator_new(0x308);
  texture::anon_unknown_0::TextureCubeLodControlTestInstance::TextureCubeLodControlTestInstance
            (this_00,context,&this->m_testsParameters);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__TextureCubeBaseLevelTestInstance_00bdeab8;
  texture::anon_unknown_0::TextureCubeMipmapTestCaseParameters::TextureCubeMipmapTestCaseParameters
            ((TextureCubeMipmapTestCaseParameters *)(this_00 + 1),&this->m_testsParameters);
  return &this_00->super_TestInstance;
}

Assistant:

virtual TestInstance*				createInstance				(Context& context) const
										{
											return new INSTANCE_TYPE(context, m_testsParameters);
										}